

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

Vec_Str_t * Vec_StrRead(char **ppStr)

{
  int *piVar1;
  Vec_Str_t *pVVar2;
  char *pStr;
  Vec_Str_t *p;
  char **ppStr_local;
  
  piVar1 = (int *)*ppStr;
  pVVar2 = Vec_StrAlloc(0);
  pVVar2->nSize = *piVar1;
  pVVar2->pArray = (char *)(piVar1 + 1);
  *ppStr = (char *)((long)piVar1 + (long)pVVar2->nSize + 4);
  return pVVar2;
}

Assistant:

Vec_Str_t * Vec_StrRead( char ** ppStr )
{
    Vec_Str_t * p;
    char * pStr = *ppStr;
    p = Vec_StrAlloc( 0 );
    p->nSize = *(int *)pStr;
    p->pArray = pStr + sizeof(int);
    *ppStr = pStr + sizeof(int) + p->nSize * sizeof(char);
    return p;
}